

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

char * get_warned_of_monster(obj *otmp)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  
  if (otmp == (obj *)0x0) {
    return (char *)0x0;
  }
  lVar2 = (long)otmp->oartifact;
  if (lVar2 == 0) {
    return (char *)0x0;
  }
  pcVar3 = (char *)(lVar2 * 0x40);
  if ((artilist[lVar2].spfx & 0x8000000) == 0) {
LAB_0014f1c8:
    bVar1 = true;
  }
  else {
    pcVar3 = (char *)artilist[lVar2].mtype;
    if ((long)pcVar3 < 0x24) {
      if (pcVar3 == (char *)0x0) goto LAB_0014f1c8;
      if (pcVar3 == (char *)0x1e) {
        pcVar3 = "dragons";
      }
      else {
LAB_0014f21a:
        pcVar3 = "something";
      }
    }
    else if (pcVar3 == (char *)0x24) {
      pcVar3 = "jabberwocks";
    }
    else if (pcVar3 == (char *)0x29) {
      pcVar3 = "ogres";
    }
    else {
      if (pcVar3 != (char *)0x2e) goto LAB_0014f21a;
      pcVar3 = "trolls";
    }
    bVar1 = false;
  }
  if (bVar1) {
    return (char *)0x0;
  }
  return pcVar3;
}

Assistant:

const char *get_warned_of_monster(const struct obj *otmp)
{
	if (otmp && otmp->oartifact) {
	    const struct artifact *arti = get_artifact(otmp);
	    if (arti->spfx & SPFX_WARN_S && arti->mtype) {
		switch (arti->mtype) {
		case S_TROLL: return "trolls"; break;
		case S_DRAGON: return "dragons"; break;
		case S_OGRE: return "ogres"; break;
		case S_JABBERWOCK: return "jabberwocks"; break;
		default: return "something"; break;
		}
	    }
	}

	return NULL;
}